

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fn.hpp
# Opt level: O2

group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq> *
rangeless::fn::in_groups_of
          (group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>
           *__return_storage_ptr__,size_t n)

{
  logic_error *this;
  string sStack_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (n != 0) {
    (__return_storage_ptr__->key_fn).chunk_size = n;
    (__return_storage_ptr__->key_fn).n_calls = 0;
    return __return_storage_ptr__;
  }
  this = (logic_error *)__cxa_allocate_exception(0x10);
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  local_b8._M_string_length = 0;
  local_b8.field_2._M_local_buf[0] = '\0';
  std::operator+(&local_98,&local_b8,
                 "/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/include/fn.hpp"
                );
  std::operator+(&local_78,&local_98,":");
  std::__cxx11::to_string(&sStack_d8,0x1055);
  std::operator+(&local_58,&local_78,&sStack_d8);
  std::operator+(&local_38,&local_58,": \"Batch size must be at least 1.\"");
  std::logic_error::logic_error(this,(string *)&local_38);
  __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

inline impl::group_adjacent_by<impl::chunker> in_groups_of(size_t n)
    {
        if(n < 1) {
            RANGELESS_FN_THROW("Batch size must be at least 1.");
        }
        return { impl::chunker{ n, 0 }, {} };
    }